

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all-to-all.hpp
# Opt level: O1

void __thiscall
diy::detail::
AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>::
AllToAllReduce(AllToAllReduce<diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::Exchanger>
               *this,Exchanger *op_,Assigner *assigner)

{
  pointer *ppBVar1;
  iterator __position;
  BlockID in_RAX;
  uint uVar2;
  ulong uVar3;
  BlockID nbr;
  BlockID local_38;
  
  this->op = op_;
  (this->all_neighbors_link).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__0014e3d8;
  (this->all_neighbors_link).neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->all_neighbors_link).neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar3 = 0;
  (this->all_neighbors_link).neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->empty_link).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__0014e3d8;
  (this->empty_link).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->empty_link).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->empty_link).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < assigner->nblocks_) {
    local_38 = in_RAX;
    do {
      local_38.proc = (*assigner->_vptr_Assigner[3])(assigner,uVar3);
      local_38.gid = (int)uVar3;
      __position._M_current =
           (this->all_neighbors_link).neighbors_.
           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->all_neighbors_link).neighbors_.
          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
        _M_realloc_insert<diy::BlockID_const&>
                  ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)
                   &(this->all_neighbors_link).neighbors_,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        ppBVar1 = &(this->all_neighbors_link).neighbors_.
                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while ((int)uVar2 < assigner->nblocks_);
  }
  return;
}

Assistant:

AllToAllReduce(const Op& op_, const Assigner& assigner):
             op(op_)
    {
      for (int gid = 0; gid < assigner.nblocks(); ++gid)
      {
        BlockID nbr = { gid, assigner.rank(gid) };
        all_neighbors_link.add_neighbor(nbr);
      }
    }